

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O1

void char_test(char *filename,FILE *fp)

{
  char *pcVar1;
  ulong uVar2;
  bidi_char *bcs;
  uint *order;
  size_t oldlen;
  size_t oldlen_00;
  uint lineno;
  long lVar3;
  ptrlen pVar4;
  ptrlen pl;
  size_t order_size;
  size_t bcs_size;
  ptrlen local_90;
  int local_80;
  uint local_7c;
  char *local_78;
  FILE *local_70;
  size_t local_68;
  void *local_60;
  ptrlen local_58;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  order = (uint *)0x0;
  local_38 = 0;
  local_40 = 0;
  bcs = (bidi_char *)0x0;
  lineno = 0;
  local_78 = filename;
  local_70 = fp;
  do {
    lineno = lineno + 1;
    pcVar1 = fgetline(fp);
    pcVar1 = chomp(pcVar1);
    if (pcVar1 != (char *)0x0) {
      if ((*pcVar1 != '\0') && (*pcVar1 != '#')) {
        local_7c = lineno;
        local_90.len = strlen(pcVar1);
        local_90.ptr = pcVar1;
        local_48 = pcVar1;
        pVar4 = ptrlen_get_word(&local_90,";");
        local_68 = pVar4.len;
        local_60 = pVar4.ptr;
        pVar4 = ptrlen_get_word(&local_90,";");
        ptrlen_get_word(&local_90,";");
        ptrlen_get_word(&local_90,";");
        local_58 = ptrlen_get_word(&local_90,";");
        pcVar1 = mkstr(pVar4);
        uVar2 = strtoul(pcVar1,(char **)0x0,0);
        safefree(pcVar1);
        local_80 = -(uint)((int)uVar2 == 1);
        if ((int)uVar2 == 0) {
          local_80 = 1;
        }
        local_90.ptr = local_60;
        local_90.len = local_68;
        if (local_68 == 0) {
          oldlen = 0;
        }
        else {
          lVar3 = 10;
          oldlen = 0;
          do {
            pVar4 = ptrlen_get_word(&local_90," ");
            pcVar1 = mkstr(pVar4);
            bcs = (bidi_char *)safegrowarray(bcs,&local_38,0xc,oldlen,1,false);
            uVar2 = strtoul(pcVar1,(char **)0x0,0x10);
            *(int *)((long)bcs + lVar3 + -6) = (int)uVar2;
            *(int *)((long)bcs + lVar3 + -10) = (int)uVar2;
            *(short *)((long)bcs + lVar3 + -2) = (short)oldlen;
            *(undefined2 *)((long)&bcs->origwc + lVar3) = 1;
            oldlen = oldlen + 1;
            safefree(pcVar1);
            lVar3 = lVar3 + 0xc;
          } while (local_90.len != 0);
        }
        oldlen_00 = 0;
        local_90.ptr = local_58.ptr;
        lineno = local_7c;
        local_90.len = local_58.len;
        while (local_7c = lineno, local_90.len != 0) {
          pVar4 = ptrlen_get_word(&local_90," ");
          pcVar1 = mkstr(pVar4);
          order = (uint *)safegrowarray(order,&local_40,4,oldlen_00,1,false);
          uVar2 = strtoul(pcVar1,(char **)0x0,0);
          order[oldlen_00] = (uint)uVar2;
          oldlen_00 = oldlen_00 + 1;
          safefree(pcVar1);
          lineno = local_7c;
        }
        run_test(local_78,lineno,bcs,oldlen,order,oldlen_00,local_80);
        fp = local_70;
        pcVar1 = local_48;
      }
      safefree(pcVar1);
    }
  } while (pcVar1 != (char *)0x0);
  safefree(bcs);
  safefree(order);
  return;
}

Assistant:

static void char_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Break each test line up into its main fields */
        ptrlen input_pl, para_dir_pl, order_pl;
        {
            ptrlen pl = ptrlen_from_asciz(line);
            input_pl = ptrlen_get_word(&pl, ";");
            para_dir_pl = ptrlen_get_word(&pl, ";");
            ptrlen_get_word(&pl, ";"); /* paragraph level, which we ignore */
            ptrlen_get_word(&pl, ";"); /* embedding levels, which we ignore */
            order_pl = ptrlen_get_word(&pl, ";");
        }

        int override;
        {
            char *para_dir_str = mkstr(para_dir_pl);
            unsigned para_dir = strtoul(para_dir_str, NULL, 0);
            sfree(para_dir_str);

            override = (para_dir == 0 ? +1 : para_dir == 1 ? -1 : 0);
        }

        /* Break up the input into Unicode characters */
        bcs_len = 0;
        {
            ptrlen pl = input_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(bcs, bcs_size, bcs_len);
                bcs[bcs_len].wc = strtoul(chrstr, NULL, 16);
                bcs[bcs_len].origwc = bcs[bcs_len].wc;
                bcs[bcs_len].index = bcs_len;
                bcs[bcs_len].nchars = 1;
                bcs_len++;
                sfree(chrstr);
            }
        }

        /* Ditto the expected output order */
        order_len = 0;
        {
            ptrlen pl = order_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(chrstr, NULL, 0);
                sfree(chrstr);
            }
        }

        run_test(filename, lineno, bcs, bcs_len, order, order_len, override);
        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}